

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O1

void __thiscall
asio::execution::detail::any_executor_base::
execute<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::write_op<asio::const_buffers_1>,asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>>>>,std::error_code,unsigned_long>>
          (any_executor_base *this,
          binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::write_op<asio::const_buffers_1>,_asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>_>_>,_std::error_code,_unsigned_long>
          *f)

{
  tuple<std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  *ptVar1;
  _func_void_any_executor_base_ptr_function_view *UNRECOVERED_JUMPTABLE;
  _func_void_any_executor_base_ptr_function_ptr *p_Var2;
  function_view fVar3;
  allocator<void> local_131;
  executor_function local_130;
  binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::write_op<asio::const_buffers_1>,_asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>_>_>,_std::error_code,_unsigned_long>
  local_128;
  
  UNRECOVERED_JUMPTABLE = this->target_fns_->blocking_execute;
  if (UNRECOVERED_JUMPTABLE != (_func_void_any_executor_base_ptr_function_view *)0x0) {
    fVar3.function_ = f;
    fVar3.complete_ =
         asio::detail::executor_function_view::
         complete<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::write_op<asio::const_buffers_1>,asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>>>>,std::error_code,unsigned_long>>
    ;
    (*UNRECOVERED_JUMPTABLE)(this,fVar3);
    return;
  }
  p_Var2 = this->target_fns_->execute;
  asio::detail::
  write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::write_op<asio::const_buffers_1>,_asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>_>_>
  ::write_op(&local_128.handler_,&f->handler_);
  local_128.arg1_._M_value = (f->arg1_)._M_value;
  local_128.arg1_._4_4_ = *(undefined4 *)&(f->arg1_).field_0x4;
  local_128.arg1_._M_cat = (f->arg1_)._M_cat;
  local_128.arg2_ = f->arg2_;
  asio::detail::executor_function::
  executor_function<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::write_op<asio::const_buffers_1>,asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>>>>,std::error_code,unsigned_long>,std::allocator<void>>
            (&local_130,&local_128,&local_131);
  (*p_Var2)(this,&local_130);
  if (local_130.impl_ != (impl_base *)0x0) {
    (*(local_130.impl_)->complete_)(local_130.impl_,false);
  }
  if (local_128.handler_.handler_.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_false>._M_head_impl.
      super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.handler_.handler_.handler_.handler_._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .super__Head_base<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_false>._M_head_impl.
               super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_128.handler_.handler_.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<1UL,_std::shared_ptr<nuraft::req_msg>,_false>._M_head_impl.
      super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.handler_.handler_.handler_.handler_._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .
               super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .super__Head_base<1UL,_std::shared_ptr<nuraft::req_msg>,_false>._M_head_impl.
               super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_128.handler_.handler_.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<2UL,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<2UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
      super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.handler_.handler_.handler_.handler_._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .
               super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .
               super__Tuple_impl<2UL,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .super__Head_base<2UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_128.handler_.handler_.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<2UL,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<3UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Head_base<3UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_false>
      ._M_head_impl.super__Function_base._M_manager != (_Manager_type)0x0) {
    ptVar1 = &local_128.handler_.handler_.handler_.handler_._M_bound_args;
    (*local_128.handler_.handler_.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<2UL,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<3UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Head_base<3UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_false>
      ._M_head_impl.super__Function_base._M_manager)
              ((_Any_data *)ptVar1,(_Any_data *)ptVar1,__destroy_functor);
  }
  return;
}

Assistant:

void execute(ASIO_MOVE_ARG(F) f) const
  {
    if (target_fns_->blocking_execute != 0)
    {
      asio::detail::non_const_lvalue<F> f2(f);
      target_fns_->blocking_execute(*this, function_view(f2.value));
    }
    else
    {
      target_fns_->execute(*this,
          function(ASIO_MOVE_CAST(F)(f), std::allocator<void>()));
    }
  }